

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O2

Index __thiscall
BayesianGameWithClusterInfo::FindTypeClusterIndex
          (BayesianGameWithClusterInfo *this,Index agI,TypeCluster *tc_previous,Index aI,Index oI)

{
  pointer ppTVar1;
  TypeCluster *pTVar2;
  const_reference ppvVar3;
  long lVar4;
  _Base_ptr p_Var5;
  E *this_00;
  pointer ppTVar6;
  _Self __tmp;
  bool bVar7;
  Index local_50;
  Index local_4c;
  
  ppvVar3 = std::
            vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
            ::at(&this->_m_typeLists,(ulong)agI);
  bVar7 = false;
  ppTVar6 = ((*ppvVar3)->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar1 = ((*ppvVar3)->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  local_50 = 0x2a;
  local_4c = 0;
  while ((ppTVar6 != ppTVar1 && (!bVar7))) {
    pTVar2 = *ppTVar6;
    p_Var5 = (pTVar2->_m_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (((_Rb_tree_header *)p_Var5 != &(pTVar2->_m_types)._M_t._M_impl.super__Rb_tree_header &&
           (!bVar7))) {
      if ((*(int *)(*(long *)(p_Var5 + 1) + 8) == 2) &&
         (((lVar4 = __dynamic_cast(*(long *)(p_Var5 + 1),&Type::typeinfo,
                                   &Type_PointerTuple::typeinfo,0),
           *(TypeCluster **)(lVar4 + 0x10) == tc_previous && (*(Index *)(lVar4 + 0x18) == aI)) &&
          (bVar7 = *(Index *)(lVar4 + 0x1c) == oI, bVar7)))) {
        local_50 = local_4c;
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    }
    local_4c = local_4c + 1;
    ppTVar6 = ppTVar6 + 1;
  }
  if (bVar7) {
    return local_50;
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"BayesianGameWithClusterInfo::FindTypeClusterIndex - no matching type found!");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

Index 
BayesianGameWithClusterInfo::FindTypeClusterIndex(
        Index agI, const TypeCluster* tc_previous, 
    Index aI, Index oI) const
{
    const TypeClusterList* tcl = _m_typeLists.at(agI);
    typeC_ci it = tcl->begin();
    typeC_ci last = tcl->end();

    Index tcI = 0; 
    Index foundtcI = 42;
    bool finished = false;
    while(it != last && !finished)
    {
        const TypeCluster* tc = *it;
        TypeCluster::type_ci it2 = tc->begin();
        TypeCluster::type_ci last2 = tc->end();
        while(it2 != last2  && !finished )
        {
            const Type* t1 = *it2;
            if(t1->GetSubClass() == Type::POINTERTUPLE)
            {
                const Type_PointerTuple* t = dynamic_cast
                    <const Type_PointerTuple*>(t1);
                if( tc_previous == t->GetPredecessor() &&
                    aI == t->GetAction() &&
                    oI == t->GetObservation() )
                {
                    finished = true;
                    foundtcI = tcI;
                }
            }
            it2++;
        }
        tcI++;
        it++;
    }
    if(!finished)
        throw E("BayesianGameWithClusterInfo::FindTypeClusterIndex - no matching type found!");

    return(foundtcI);
}